

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintToChar<char16_t>(char16_t value,iu_ostream *os)

{
  ushort uVar1;
  size_t sVar2;
  ostream *poVar3;
  byte bVar4;
  size_t i;
  long lVar5;
  char16_t *str_00;
  byte bVar6;
  ushort uVar7;
  undefined6 in_register_0000003a;
  char16_t str [2];
  uint local_50;
  undefined1 local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((int)CONCAT62(in_register_0000003a,value) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    return;
  }
  if ((ushort)value < 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
    local_50 = 0;
    bVar4 = 0xc;
    lVar5 = 0;
    do {
      uVar1 = (ushort)value >> (bVar4 & 0x1f);
      uVar7 = uVar1 & 0xf;
      bVar6 = (char)uVar7 + 0x37;
      if (uVar7 < 10) {
        bVar6 = (byte)uVar1 | 0x30;
      }
      *(byte *)((long)&local_50 + lVar5) = bVar6;
      lVar5 = lVar5 + 1;
      bVar4 = bVar4 - 4;
    } while (lVar5 != 4);
    local_4c = 0;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = strlen((char *)&local_50);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,&local_50,(long)&local_50 + sVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  else {
    local_50 = (uint)(ushort)value;
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    CodeConvert<char16_t,char,__mbstate_t>(&local_48,(detail *)&local_50,str_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}